

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

string * __thiscall
cmGeneratorTarget::CheckCMP0004(string *__return_storage_ptr__,cmGeneratorTarget *this,string *item)

{
  pointer pcVar1;
  size_t __n;
  int iVar2;
  PolicyStatus PVar3;
  long lVar4;
  cmake *this_00;
  ostream *poVar5;
  PolicyID id;
  PolicyID id_00;
  ostringstream e;
  string local_1d8;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [360];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (item->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + item->_M_string_length);
  lVar4 = std::__cxx11::string::find_first_not_of((char *)__return_storage_ptr__,0x491832,0);
  if (lVar4 != -1) {
    std::__cxx11::string::substr((ulong)local_1a8,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_1a8);
    if ((cmLocalGenerator *)local_1a8._0_8_ != (cmLocalGenerator *)local_198) {
      operator_delete((void *)local_1a8._0_8_,(ulong)(local_198._0_8_ + 1));
    }
  }
  lVar4 = std::__cxx11::string::find_last_not_of
                    ((char *)__return_storage_ptr__,0x491832,0xffffffffffffffff);
  if (lVar4 != -1) {
    std::__cxx11::string::substr((ulong)local_1a8,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_1a8);
    if ((cmLocalGenerator *)local_1a8._0_8_ != (cmLocalGenerator *)local_198) {
      operator_delete((void *)local_1a8._0_8_,(ulong)(local_198._0_8_ + 1));
    }
  }
  __n = __return_storage_ptr__->_M_string_length;
  if (__n == item->_M_string_length) {
    if (__n == 0) {
      return __return_storage_ptr__;
    }
    iVar2 = bcmp((__return_storage_ptr__->_M_dataplus)._M_p,(item->_M_dataplus)._M_p,__n);
    if (iVar2 == 0) {
      return __return_storage_ptr__;
    }
  }
  this_00 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
  PVar3 = cmPolicies::PolicyMap::Get(&this->PolicyMap,CMP0004);
  if (PVar3 - REQUIRED_IF_USED < 2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_1d8,(cmPolicies *)&DAT_00000004,id);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Target \"",8);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(this->Target->Name)._M_dataplus._M_p,
                        (this->Target->Name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" links to item \"",0x11);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(item->_M_dataplus)._M_p,item->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"\" which has leading or trailing whitespace.",0x2b);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    GetBacktrace((cmGeneratorTarget *)local_1b8);
    cmake::IssueMessage(this_00,FATAL_ERROR,&local_1d8,(cmListFileBacktrace *)local_1b8);
LAB_00170543:
    if ((cmMakefile *)local_1b8._8_8_ != (cmMakefile *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p == &local_1d8.field_2) goto LAB_00170568;
  }
  else {
    if (PVar3 == WARN) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1d8,(cmPolicies *)&DAT_00000004,id_00);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Target \"",8);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(this->Target->Name)._M_dataplus._M_p,
                          (this->Target->Name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" links to item \"",0x11);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(item->_M_dataplus)._M_p,item->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"\" which has leading or trailing whitespace.",0x2b);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringbuf::str();
      GetBacktrace((cmGeneratorTarget *)local_1b8);
      cmake::IssueMessage(this_00,AUTHOR_WARNING,&local_1d8,(cmListFileBacktrace *)local_1b8);
      goto LAB_00170543;
    }
    if (PVar3 != NEW) {
      return __return_storage_ptr__;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Target \"",8);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(this->Target->Name)._M_dataplus._M_p,
                        (this->Target->Name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" links to item \"",0x11);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(item->_M_dataplus)._M_p,item->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"\" which has leading or trailing whitespace.  ",0x2d);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"This is now an error according to policy CMP0004.",0x31);
    std::__cxx11::stringbuf::str();
    GetBacktrace((cmGeneratorTarget *)local_1b8);
    cmake::IssueMessage(this_00,FATAL_ERROR,&local_1d8,(cmListFileBacktrace *)local_1b8);
    if ((cmMakefile *)local_1b8._8_8_ != (cmMakefile *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p == &local_1d8.field_2) goto LAB_00170568;
  }
  operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
LAB_00170568:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x60));
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::CheckCMP0004(std::string const& item) const
{
  // Strip whitespace off the library names because we used to do this
  // in case variables were expanded at generate time.  We no longer
  // do the expansion but users link to libraries like " ${VAR} ".
  std::string lib = item;
  std::string::size_type pos = lib.find_first_not_of(" \t\r\n");
  if (pos != std::string::npos) {
    lib = lib.substr(pos);
  }
  pos = lib.find_last_not_of(" \t\r\n");
  if (pos != std::string::npos) {
    lib = lib.substr(0, pos + 1);
  }
  if (lib != item) {
    cmake* cm = this->LocalGenerator->GetCMakeInstance();
    switch (this->GetPolicyStatusCMP0004()) {
      case cmPolicies::WARN: {
        std::ostringstream w;
        w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0004) << "\n"
          << "Target \"" << this->GetName() << "\" links to item \"" << item
          << "\" which has leading or trailing whitespace.";
        cm->IssueMessage(MessageType::AUTHOR_WARNING, w.str(),
                         this->GetBacktrace());
      }
      case cmPolicies::OLD:
        break;
      case cmPolicies::NEW: {
        std::ostringstream e;
        e << "Target \"" << this->GetName() << "\" links to item \"" << item
          << "\" which has leading or trailing whitespace.  "
          << "This is now an error according to policy CMP0004.";
        cm->IssueMessage(MessageType::FATAL_ERROR, e.str(),
                         this->GetBacktrace());
      } break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS: {
        std::ostringstream e;
        e << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0004) << "\n"
          << "Target \"" << this->GetName() << "\" links to item \"" << item
          << "\" which has leading or trailing whitespace.";
        cm->IssueMessage(MessageType::FATAL_ERROR, e.str(),
                         this->GetBacktrace());
      } break;
    }
  }
  return lib;
}